

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O1

int valequal(lys_node *node,char *noncan_val,int noncan_val_len,char *can_val)

{
  int iVar1;
  lys_type *plVar2;
  lys_node *plVar3;
  uint uVar4;
  lyd_node_leaf_list local_78;
  
  local_78.value.binary = (char *)0x0;
  local_78.value_type = LY_TYPE_DER;
  local_78.value_flags = '\0';
  local_78._77_3_ = 0;
  local_78.hash = 0;
  local_78._52_4_ = 0;
  local_78.value_str = (char *)0x0;
  local_78.prev = (lyd_node *)0x0;
  local_78.parent = (lyd_node *)0x0;
  local_78.attr = (lyd_attr *)0x0;
  local_78.next = (lyd_node *)0x0;
  local_78.schema = (lys_node *)0x0;
  local_78.validity = '\0';
  local_78._9_7_ = 0;
  local_78.value_str = lydict_insert(node->module->ctx,noncan_val,(long)noncan_val_len);
  plVar3 = node;
  do {
    local_78.schema = node;
    if (*(LY_DATA_TYPE *)&plVar3[1].ref != LY_TYPE_LEAFREF) {
      local_78.value_type = *(LY_DATA_TYPE *)&plVar3[1].ref;
      plVar2 = lyp_parse_value((lys_type *)&plVar3[1].ref,&local_78.value_str,(lyxml_elem *)0x0,
                               &local_78,(lyd_attr *)0x0,(lys_module *)0x0,0,0,0);
      if (plVar2 == (lys_type *)0x0) goto LAB_0011f741;
      iVar1 = strcmp(local_78.value_str,can_val);
      uVar4 = (uint)(iVar1 == 0);
      goto LAB_0011f747;
    }
    plVar3 = *(lys_node **)&plVar3[1].nodetype;
  } while (plVar3 != (lys_node *)0x0);
  local_78.value_type = LY_TYPE_LEAFREF;
  ly_log(node->module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
         "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
         ,0x1146);
LAB_0011f741:
  uVar4 = 0xffffffff;
LAB_0011f747:
  lydict_remove(node->module->ctx,local_78.value_str);
  return uVar4;
}

Assistant:

static int
valequal(struct lys_node *node, const char *noncan_val, int noncan_val_len, const char *can_val)
{
    int ret;
    struct lyd_node_leaf_list leaf;
    struct lys_node_leaf *sleaf = (struct lys_node_leaf*)node;

    /* dummy leaf */
    memset(&leaf, 0, sizeof leaf);
    leaf.value_str = lydict_insert(node->module->ctx, noncan_val, noncan_val_len);

repeat:
    leaf.value_type = sleaf->type.base;
    leaf.schema = node;

    if (leaf.value_type == LY_TYPE_LEAFREF) {
        if (!sleaf->type.info.lref.target) {
            /* it should either be unresolved leafref (leaf.value_type are ORed flags) or it will be resolved */
            LOGINT(node->module->ctx);
            ret = -1;
            goto finish;
        }
        sleaf = sleaf->type.info.lref.target;
        goto repeat;
    } else {
        if (!lyp_parse_value(&sleaf->type, &leaf.value_str, NULL, &leaf, NULL, NULL, 0, 0, 0)) {
            ret = -1;
            goto finish;
        }
    }

    if (!strcmp(leaf.value_str, can_val)) {
        ret = 1;
    } else {
        ret = 0;
    }

finish:
    lydict_remove(node->module->ctx, leaf.value_str);
    return ret;
}